

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_cast.cpp
# Opt level: O0

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundCastExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  optional_ptr<duckdb::FunctionLocalState,_true> sel_00;
  reference count_00;
  pointer result_00;
  ExpressionExecutor *in_RCX;
  BaseExpression *in_RSI;
  BoundCastData *in_RDI;
  Expression *in_R8;
  ExpressionState *in_R9;
  CastParameters parameters_1;
  CastParameters parameters;
  string error_message;
  pointer child_state;
  value_type *child;
  optional_ptr<duckdb::FunctionLocalState,_true> lstate;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  string *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  string *this_00;
  undefined1 uVar1;
  CastParameters *in_stack_ffffffffffffff08;
  optional_ptr<duckdb::FunctionLocalState,_true> in_stack_ffffffffffffff10;
  undefined1 auStack_e8 [32];
  idx_t iStack_c8;
  idx_t iStack_b8;
  DataChunk *in_stack_ffffffffffffff50;
  undefined1 auStack_98 [32];
  idx_t iStack_78;
  string asStack_68 [32];
  
  uVar1 = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  sel_00 = ExecuteFunctionState::GetFunctionState
                     ((ExpressionState *)
                      CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  DataChunk::Reset(in_stack_ffffffffffffff50);
  count_00 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffef0,
                        CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                *)in_stack_fffffffffffffef0,
               CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  result_00 = ::std::
              unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>::
              get((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                   *)in_stack_fffffffffffffef0);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffef0);
  Execute(in_RCX,in_R8,in_R9,(SelectionVector *)sel_00.ptr,(idx_t)count_00,(Vector *)result_00);
  if ((in_RSI[1].alias.field_2._M_local_buf[8] & 1U) == 0) {
    ::std::unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>::get
              ((unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> *)
               in_stack_fffffffffffffef0);
    CastParameters::CastParameters
              (in_stack_ffffffffffffff08,in_RDI,(bool)uVar1,in_stack_fffffffffffffef0,sel_00,
               (bool)in_stack_fffffffffffffeef);
    iStack_c8 = (idx_t)BaseExpression::GetQueryLocation(in_RSI);
    (*(code *)in_RSI[1].query_location.index)(count_00,in_R9,in_R8,auStack_e8);
  }
  else {
    this_00 = asStack_68;
    ::std::__cxx11::string::string(this_00);
    uVar1 = (undefined1)((ulong)this_00 >> 0x38);
    ::std::unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>::get
              ((unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> *)
               in_stack_fffffffffffffef0);
    CastParameters::CastParameters
              (in_stack_ffffffffffffff08,in_RDI,(bool)uVar1,in_stack_fffffffffffffef0,
               in_stack_ffffffffffffff10,(bool)in_stack_fffffffffffffeef);
    iStack_b8 = (idx_t)BaseExpression::GetQueryLocation(in_RSI);
    iStack_78 = iStack_b8;
    (*(code *)in_RSI[1].query_location.index)(count_00,in_R9,in_R8,auStack_98);
    ::std::__cxx11::string::~string(asStack_68);
  }
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundCastExpression &expr, ExpressionState *state, const SelectionVector *sel,
                                 idx_t count, Vector &result) {
	auto lstate = ExecuteFunctionState::GetFunctionState(*state);

	// resolve the child
	state->intermediate_chunk.Reset();

	auto &child = state->intermediate_chunk.data[0];
	auto child_state = state->child_states[0].get();

	Execute(*expr.child, child_state, sel, count, child);
	if (expr.try_cast) {
		string error_message;
		CastParameters parameters(expr.bound_cast.cast_data.get(), false, &error_message, lstate);
		parameters.query_location = expr.GetQueryLocation();
		expr.bound_cast.function(child, result, count, parameters);
	} else {
		// cast it to the type specified by the cast expression
		D_ASSERT(result.GetType() == expr.return_type);
		CastParameters parameters(expr.bound_cast.cast_data.get(), false, nullptr, lstate);
		parameters.query_location = expr.GetQueryLocation();
		expr.bound_cast.function(child, result, count, parameters);
	}
}